

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3MallocAlarm(int nByte)

{
  int in_EDI;
  
  if (0 < mem0.alarmThreshold) {
    sqlite3_mutex_leave((sqlite3_mutex *)0x15255d);
    sqlite3_release_memory(in_EDI);
    sqlite3_mutex_enter((sqlite3_mutex *)0x152572);
  }
  return;
}

Assistant:

static void sqlite3MallocAlarm(int nByte){
  if( mem0.alarmThreshold<=0 ) return;
  sqlite3_mutex_leave(mem0.mutex);
  sqlite3_release_memory(nByte);
  sqlite3_mutex_enter(mem0.mutex);
}